

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

bool_t prf_header_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint8_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  int16_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint8_t *buffer;
  uint len;
  bool_t bVar7;
  uint uVar8;
  float64_t fVar9;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_header_info.opcode) {
    uVar3 = bf_get_uint16_be(bfile);
    node->length = uVar3;
    uVar8 = 4;
    if (4 < uVar3) {
      buffer = node->data;
      if (buffer == (uint8_t *)0x0) {
        pool_id = state->model->mempool_id;
        if (pool_id == 0) {
          buffer = (uint8_t *)malloc((ulong)(uVar3 - 4) + 6);
        }
        else {
          buffer = (uint8_t *)pool_malloc(pool_id,uVar3 + 2);
        }
        node->data = buffer;
        if (buffer == (uint8_t *)0x0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          uVar8 = 4;
          goto LAB_00105dfa;
        }
        uVar3 = node->length;
      }
      if (0xb < uVar3) {
        bf_read(bfile,buffer,8);
        uVar3 = node->length;
        if (uVar3 < 0x10) {
          uVar8 = 0xc;
        }
        else {
          iVar5 = bf_get_int32_be(bfile);
          *(int32_t *)(buffer + 8) = iVar5;
          uVar3 = node->length;
          if (uVar3 < 0x14) {
            uVar8 = 0x10;
          }
          else {
            iVar5 = bf_get_int32_be(bfile);
            *(int32_t *)(buffer + 0xc) = iVar5;
            uVar3 = node->length;
            if (uVar3 < 0x34) {
              uVar8 = 0x14;
            }
            else {
              bf_read(bfile,buffer + 0x10,0x20);
              uVar3 = node->length;
              if (uVar3 < 0x36) {
                uVar8 = 0x34;
              }
              else {
                iVar4 = bf_get_int16_be(bfile);
                *(int16_t *)(buffer + 0x30) = iVar4;
                uVar3 = node->length;
                if (uVar3 < 0x38) {
                  uVar8 = 0x36;
                }
                else {
                  iVar4 = bf_get_int16_be(bfile);
                  *(int16_t *)(buffer + 0x32) = iVar4;
                  uVar3 = node->length;
                  if (uVar3 < 0x3a) {
                    uVar8 = 0x38;
                  }
                  else {
                    iVar4 = bf_get_int16_be(bfile);
                    *(int16_t *)(buffer + 0x34) = iVar4;
                    uVar3 = node->length;
                    if (uVar3 < 0x3c) {
                      uVar8 = 0x3a;
                    }
                    else {
                      iVar4 = bf_get_int16_be(bfile);
                      *(int16_t *)(buffer + 0x36) = iVar4;
                      uVar3 = node->length;
                      if (uVar3 < 0x3e) {
                        uVar8 = 0x3c;
                      }
                      else {
                        iVar4 = bf_get_int16_be(bfile);
                        *(int16_t *)(buffer + 0x38) = iVar4;
                        uVar3 = node->length;
                        if (uVar3 < 0x3f) {
                          uVar8 = 0x3e;
                        }
                        else {
                          uVar1 = bf_get_int8(bfile);
                          buffer[0x3a] = uVar1;
                          uVar3 = node->length;
                          if (uVar3 < 0x40) {
                            uVar8 = 0x3f;
                          }
                          else {
                            uVar1 = bf_get_int8(bfile);
                            buffer[0x3b] = uVar1;
                            uVar3 = node->length;
                            if (uVar3 < 0x44) {
                              uVar8 = 0x40;
                            }
                            else {
                              uVar6 = bf_get_uint32_be(bfile);
                              *(uint32_t *)(buffer + 0x3c) = uVar6;
                              uVar3 = node->length;
                              if (uVar3 < 0x48) {
                                uVar8 = 0x44;
                              }
                              else {
                                iVar5 = bf_get_int32_be(bfile);
                                *(int32_t *)(buffer + 0x40) = iVar5;
                                uVar3 = node->length;
                                if (uVar3 < 0x4c) {
                                  uVar8 = 0x48;
                                }
                                else {
                                  iVar5 = bf_get_int32_be(bfile);
                                  *(int32_t *)(buffer + 0x44) = iVar5;
                                  uVar3 = node->length;
                                  if (uVar3 < 0x50) {
                                    uVar8 = 0x4c;
                                  }
                                  else {
                                    iVar5 = bf_get_int32_be(bfile);
                                    *(int32_t *)(buffer + 0x48) = iVar5;
                                    uVar3 = node->length;
                                    if (uVar3 < 0x54) {
                                      uVar8 = 0x50;
                                    }
                                    else {
                                      iVar5 = bf_get_int32_be(bfile);
                                      *(int32_t *)(buffer + 0x4c) = iVar5;
                                      uVar3 = node->length;
                                      if (uVar3 < 0x58) {
                                        uVar8 = 0x54;
                                      }
                                      else {
                                        iVar5 = bf_get_int32_be(bfile);
                                        *(int32_t *)(buffer + 0x50) = iVar5;
                                        uVar3 = node->length;
                                        if (uVar3 < 0x5c) {
                                          uVar8 = 0x58;
                                        }
                                        else {
                                          iVar5 = bf_get_int32_be(bfile);
                                          *(int32_t *)(buffer + 0x54) = iVar5;
                                          uVar3 = node->length;
                                          if (uVar3 < 0x60) {
                                            uVar8 = 0x5c;
                                          }
                                          else {
                                            iVar5 = bf_get_int32_be(bfile);
                                            *(int32_t *)(buffer + 0x58) = iVar5;
                                            uVar3 = node->length;
                                            if (uVar3 < 100) {
                                              uVar8 = 0x60;
                                            }
                                            else {
                                              iVar5 = bf_get_int32_be(bfile);
                                              *(int32_t *)(buffer + 0x5c) = iVar5;
                                              uVar3 = node->length;
                                              if (uVar3 < 0x68) {
                                                uVar8 = 100;
                                              }
                                              else {
                                                iVar5 = bf_get_int32_be(bfile);
                                                *(int32_t *)(buffer + 0x60) = iVar5;
                                                uVar3 = node->length;
                                                if (uVar3 < 0x6c) {
                                                  uVar8 = 0x68;
                                                }
                                                else {
                                                  iVar5 = bf_get_int32_be(bfile);
                                                  *(int32_t *)(buffer + 100) = iVar5;
                                                  uVar3 = node->length;
                                                  if (uVar3 < 0x70) {
                                                    uVar8 = 0x6c;
                                                  }
                                                  else {
                                                    iVar5 = bf_get_int32_be(bfile);
                                                    *(int32_t *)(buffer + 0x68) = iVar5;
                                                    uVar3 = node->length;
                                                    if (uVar3 < 0x74) {
                                                      uVar8 = 0x70;
                                                    }
                                                    else {
                                                      iVar5 = bf_get_int32_be(bfile);
                                                      *(int32_t *)(buffer + 0x6c) = iVar5;
                                                      uVar3 = node->length;
                                                      if (uVar3 < 0x78) {
                                                        uVar8 = 0x74;
                                                      }
                                                      else {
                                                        iVar5 = bf_get_int32_be(bfile);
                                                        *(int32_t *)(buffer + 0x70) = iVar5;
                                                        uVar3 = node->length;
                                                        if (uVar3 < 0x7c) {
                                                          uVar8 = 0x78;
                                                        }
                                                        else {
                                                          iVar5 = bf_get_int32_be(bfile);
                                                          *(int32_t *)(buffer + 0x74) = iVar5;
                                                          uVar3 = node->length;
                                                          if (uVar3 < 0x7e) {
                                                            uVar8 = 0x7c;
                                                          }
                                                          else {
                                                            iVar4 = bf_get_int16_be(bfile);
                                                            *(int16_t *)(buffer + 0x78) = iVar4;
                                                            uVar3 = node->length;
                                                            if (uVar3 < 0x80) {
                                                              uVar8 = 0x7e;
                                                            }
                                                            else {
                                                              iVar4 = bf_get_int16_be(bfile);
                                                              *(int16_t *)(buffer + 0x7a) = iVar4;
                                                              if (iVar4 != 1) {
                                                                prf_warn(3,
                                                  "vertex storage type (%d) may not be supported\n",
                                                  (ulong)(uint)(int)iVar4);
                                                  }
                                                  uVar3 = node->length;
                                                  uVar8 = 0x80;
                                                  if (0x83 < uVar3) {
                                                    iVar5 = bf_get_int32_be(bfile);
                                                    *(int32_t *)(buffer + 0x7c) = iVar5;
                                                    uVar3 = node->length;
                                                    uVar8 = 0x84;
                                                    if (0x8b < uVar3) {
                                                      fVar9 = bf_get_float64_be(bfile);
                                                      *(float64_t *)(buffer + 0x80) = fVar9;
                                                      uVar3 = node->length;
                                                      uVar8 = 0x8c;
                                                      if (0x93 < uVar3) {
                                                        fVar9 = bf_get_float64_be(bfile);
                                                        *(float64_t *)(buffer + 0x88) = fVar9;
                                                        uVar3 = node->length;
                                                        uVar8 = 0x94;
                                                        if (0x9b < uVar3) {
                                                          fVar9 = bf_get_float64_be(bfile);
                                                          *(float64_t *)(buffer + 0x90) = fVar9;
                                                          uVar3 = node->length;
                                                          uVar8 = 0x9c;
                                                          if (0xa3 < uVar3) {
                                                            fVar9 = bf_get_float64_be(bfile);
                                                            *(float64_t *)(buffer + 0x98) = fVar9;
                                                            uVar3 = node->length;
                                                            uVar8 = 0xa4;
                                                            if (0xa5 < uVar3) {
                                                              iVar4 = bf_get_int16_be(bfile);
                                                              *(int16_t *)(buffer + 0xa0) = iVar4;
                                                              uVar3 = node->length;
                                                              uVar8 = 0xa6;
                                                              if (0xa7 < uVar3) {
                                                                iVar4 = bf_get_int16_be(bfile);
                                                                *(int16_t *)(buffer + 0xa2) = iVar4;
                                                                uVar3 = node->length;
                                                                uVar8 = 0xa8;
                                                                if (0xab < uVar3) {
                                                                  iVar5 = bf_get_int32_be(bfile);
                                                                  *(int32_t *)(buffer + 0xa4) =
                                                                       iVar5;
                                                                  uVar3 = node->length;
                                                                  uVar8 = 0xac;
                                                                  if (0xaf < uVar3) {
                                                                    iVar5 = bf_get_int32_be(bfile);
                                                                    *(int32_t *)(buffer + 0xa8) =
                                                                         iVar5;
                                                                    uVar3 = node->length;
                                                                    uVar8 = 0xb0;
                                                                    if (0xb1 < uVar3) {
                                                                      iVar4 = bf_get_int16_be(bfile)
                                                                      ;
                                                                      *(int16_t *)(buffer + 0xac) =
                                                                           iVar4;
                                                                      uVar3 = node->length;
                                                                      uVar8 = 0xb2;
                                                                      if (0xb3 < uVar3) {
                                                                        iVar4 = bf_get_int16_be(
                                                  bfile);
                                                  *(int16_t *)(buffer + 0xae) = iVar4;
                                                  uVar3 = node->length;
                                                  uVar8 = 0xb4;
                                                  if (0xb5 < uVar3) {
                                                    iVar4 = bf_get_int16_be(bfile);
                                                    *(int16_t *)(buffer + 0xb0) = iVar4;
                                                    uVar3 = node->length;
                                                    uVar8 = 0xb6;
                                                    if (0xb7 < uVar3) {
                                                      iVar4 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(buffer + 0xb2) = iVar4;
                                                      uVar3 = node->length;
                                                      uVar8 = 0xb8;
                                                      if (0xbb < uVar3) {
                                                        iVar5 = bf_get_int32_be(bfile);
                                                        *(int32_t *)(buffer + 0xb4) = iVar5;
                                                        uVar3 = node->length;
                                                        uVar8 = 0xbc;
                                                        if (0xc3 < uVar3) {
                                                          fVar9 = bf_get_float64_be(bfile);
                                                          *(float64_t *)(buffer + 0xb8) = fVar9;
                                                          uVar3 = node->length;
                                                          uVar8 = 0xc4;
                                                          if (0xcb < uVar3) {
                                                            fVar9 = bf_get_float64_be(bfile);
                                                            *(float64_t *)(buffer + 0xc0) = fVar9;
                                                            uVar3 = node->length;
                                                            uVar8 = 0xcc;
                                                            if (0xd3 < uVar3) {
                                                              fVar9 = bf_get_float64_be(bfile);
                                                              *(float64_t *)(buffer + 200) = fVar9;
                                                              uVar3 = node->length;
                                                              uVar8 = 0xd4;
                                                              if (0xdb < uVar3) {
                                                                fVar9 = bf_get_float64_be(bfile);
                                                                *(float64_t *)(buffer + 0xd0) =
                                                                     fVar9;
                                                                uVar3 = node->length;
                                                                uVar8 = 0xdc;
                                                                if (0xe3 < uVar3) {
                                                                  fVar9 = bf_get_float64_be(bfile);
                                                                  *(float64_t *)(buffer + 0xd8) =
                                                                       fVar9;
                                                                  uVar3 = node->length;
                                                                  uVar8 = 0xe4;
                                                                  if (0xeb < uVar3) {
                                                                    fVar9 = bf_get_float64_be(bfile)
                                                                    ;
                                                                    *(float64_t *)(buffer + 0xe0) =
                                                                         fVar9;
                                                                    uVar3 = node->length;
                                                                    uVar8 = 0xec;
                                                                    if (0xf3 < uVar3) {
                                                                      fVar9 = bf_get_float64_be(
                                                  bfile);
                                                  *(float64_t *)(buffer + 0xe8) = fVar9;
                                                  uVar3 = node->length;
                                                  uVar8 = 0xf4;
                                                  if (0xfb < uVar3) {
                                                    fVar9 = bf_get_float64_be(bfile);
                                                    *(float64_t *)(buffer + 0xf0) = fVar9;
                                                    uVar3 = node->length;
                                                    uVar8 = 0xfc;
                                                    if (0xfd < uVar3) {
                                                      iVar4 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(buffer + 0xf8) = iVar4;
                                                      uVar3 = node->length;
                                                      uVar8 = 0xfe;
                                                      if (0xff < uVar3) {
                                                        iVar4 = bf_get_int16_be(bfile);
                                                        *(int16_t *)(buffer + 0xfa) = iVar4;
                                                        uVar3 = node->length;
                                                        uVar8 = 0x100;
                                                        if (0x101 < uVar3) {
                                                          iVar4 = bf_get_int16_be(bfile);
                                                          *(int16_t *)(buffer + 0xfc) = iVar4;
                                                          uVar3 = node->length;
                                                          uVar8 = 0x102;
                                                          if (0x103 < uVar3) {
                                                            iVar4 = bf_get_int16_be(bfile);
                                                            *(int16_t *)(buffer + 0xfe) = iVar4;
                                                            uVar3 = node->length;
                                                            uVar8 = 0x104;
                                                            if (0x105 < uVar3) {
                                                              iVar4 = bf_get_int16_be(bfile);
                                                              *(int16_t *)(buffer + 0x100) = iVar4;
                                                              uVar3 = node->length;
                                                              uVar8 = 0x106;
                                                              if (0x107 < uVar3) {
                                                                iVar4 = bf_get_int16_be(bfile);
                                                                *(int16_t *)(buffer + 0x102) = iVar4
                                                                ;
                                                                uVar3 = node->length;
                                                                uVar8 = 0x108;
                                                                if (0x109 < uVar3) {
                                                                  iVar4 = bf_get_int16_be(bfile);
                                                                  *(int16_t *)(buffer + 0x104) =
                                                                       iVar4;
                                                                  uVar3 = node->length;
                                                                  uVar8 = 0x10a;
                                                                  if (0x10b < uVar3) {
                                                                    iVar4 = bf_get_int16_be(bfile);
                                                                    *(int16_t *)(buffer + 0x106) =
                                                                         iVar4;
                                                                    uVar3 = node->length;
                                                                    uVar8 = 0x10c;
                                                                    if (0x10f < uVar3) {
                                                                      iVar5 = bf_get_int32_be(bfile)
                                                                      ;
                                                                      *(int32_t *)(buffer + 0x108) =
                                                                           iVar5;
                                                                      uVar3 = node->length;
                                                                      uVar8 = 0x110;
                                                                      if (0x111 < uVar3) {
                                                                        iVar4 = bf_get_int16_be(
                                                  bfile);
                                                  *(int16_t *)(buffer + 0x10c) = iVar4;
                                                  uVar3 = node->length;
                                                  uVar8 = 0x112;
                                                  if (0x113 < uVar3) {
                                                    iVar4 = bf_get_int16_be(bfile);
                                                    *(int16_t *)(buffer + 0x10e) = iVar4;
                                                    uVar3 = node->length;
                                                    uVar8 = 0x114;
                                                    if (0x115 < uVar3) {
                                                      iVar4 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(buffer + 0x110) = iVar4;
                                                      uVar3 = node->length;
                                                      uVar8 = 0x116;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar7 = 1;
    len = uVar3 - uVar8;
    if (uVar8 <= uVar3 && len != 0) {
      bf_read(bfile,node->data + (ulong)uVar8 + 2,len);
    }
  }
  else {
    prf_error(9,"tried header load method for node of type %d.",(ulong)uVar2);
    uVar8 = 2;
LAB_00105dfa:
    bVar7 = 0;
    bf_rewind(bfile,uVar8);
  }
  return bVar7;
}

Assistant:

static
bool_t
prf_header_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint16_t pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    pos = 4;

    if ( (node->length > 4) && (node->data == NULL) ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_read( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->format_revision_level = bf_get_int32_be( bfile ); pos += 4;
/*
        fprintf( stderr, "Open Flight revision level: %d\n",
            data->format_revision_level );
*/
        if ( node->length < (pos + 4) ) break;
        data->edit_revision_level = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_read( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        data->next_group = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_lod = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_object = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_face = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->unit_multiplier_divisor = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        data->vertex_coordinate_units = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->texwhite = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->projection_type = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[6] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_dof = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->vertex_storage_type = bf_get_int16_be( bfile ); pos += 2;
        if ( data->vertex_storage_type != 1 ) {
            prf_warn( 3, "vertex storage type (%d) may not be supported\n",
                data->vertex_storage_type );
            /* bf_rewind( bfile, pos ); return FALSE; */
        }
        if ( node->length < (pos + 4) ) break;
        data->database_origin = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_x, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_y, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_x, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_y, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_sound = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_path = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_clip = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_text = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_bsp = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_switch = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_latitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_longitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_upper_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_lower_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_light_source = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_light_point = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_road = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_cat = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved8 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->earth_ellipsoid_model = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_adaptive = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_curve = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved9 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}